

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

CopyResult
cmSystemTools::CopySingleFile
          (string *oldname,string *newname,CopyWhen when,CopyInputRecent inputRecent,string *err)

{
  bool bVar1;
  Status SVar2;
  string *this;
  CopyStatus CVar3;
  mode_t perm;
  CopyStatus local_80;
  Status local_70;
  string local_68;
  string local_48;
  
  if ((when == OnlyIfDifferent) &&
     (bVar1 = cmsys::SystemTools::FilesDiffer(oldname,newname), !bVar1)) {
    return Success;
  }
  perm = 0;
  SVar2 = cmsys::SystemTools::GetPermissions(oldname,&perm);
  bVar1 = cmsys::SystemTools::SameFile(oldname,newname);
  if (bVar1) {
    return Success;
  }
  CVar3 = cmsys::SystemTools::CloneFileContent(oldname,newname);
  if ((CVar3.super_Status.Kind_ == Success) ||
     (local_80 = cmsys::SystemTools::CopyFileContentBlockwise(oldname,newname),
     local_80.super_Status.Kind_ == Success)) {
    if (SVar2.Kind_ != Success) {
      return Success;
    }
    local_70 = cmsys::SystemTools::SetPermissions(newname,perm,false);
    if (local_70.Kind_ == Success) {
      return Success;
    }
    if (err == (string *)0x0) {
      return Failure;
    }
    cmsys::Status::GetString_abi_cxx11_(&local_48,&local_70);
    cmStrCat<std::__cxx11::string,char_const(&)[10]>(&local_68,&local_48,(char (*) [10])" (output)")
    ;
    std::__cxx11::string::operator=((string *)err,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    this = &local_48;
  }
  else {
    if (err == (string *)0x0) {
      return Failure;
    }
    cmsys::Status::GetString_abi_cxx11_(&local_68,&local_80.super_Status);
    std::__cxx11::string::operator=((string *)err,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_80.Path == DestPath) {
      cmStrCat<std::__cxx11::string&,char_const(&)[10]>(&local_68,err,(char (*) [10])" (output)");
    }
    else {
      if (local_80.Path != SourcePath) {
        return Failure;
      }
      cmStrCat<std::__cxx11::string&,char_const(&)[9]>(&local_68,err,(char (*) [9])" (input)");
    }
    this = &local_68;
    std::__cxx11::string::operator=((string *)err,(string *)this);
  }
  std::__cxx11::string::~string((string *)this);
  return Failure;
}

Assistant:

cmSystemTools::CopyResult cmSystemTools::CopySingleFile(
  std::string const& oldname, std::string const& newname, CopyWhen when,
  CopyInputRecent inputRecent, std::string* err)
{
  switch (when) {
    case CopyWhen::Always:
      break;
    case CopyWhen::OnlyIfDifferent:
      if (!FilesDiffer(oldname, newname)) {
        return CopyResult::Success;
      }
      break;
  }

  mode_t perm = 0;
  cmsys::Status perms = SystemTools::GetPermissions(oldname, perm);

  // If files are the same do not copy
  if (SystemTools::SameFile(oldname, newname)) {
    return CopyResult::Success;
  }

  cmsys::SystemTools::CopyStatus status;
  status = cmsys::SystemTools::CloneFileContent(oldname, newname);
  if (!status) {
    // if cloning did not succeed, fall back to blockwise copy
#ifdef _WIN32
    if (inputRecent == CopyInputRecent::Yes) {
      // Windows sometimes locks a file immediately after creation.
      // Retry a few times.
      WindowsFileRetry retry = cmSystemTools::GetWindowsFileRetry();
      while ((status =
                cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname),
              status.Path == cmsys::SystemTools::CopyStatus::SourcePath &&
                status.GetPOSIX() == EACCES && --retry.Count)) {
        cmSystemTools::Delay(retry.Delay);
      }
    } else {
      status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
    }
#else
    static_cast<void>(inputRecent);
    status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
#endif
  }
  if (!status) {
    if (err) {
      *err = status.GetString();
      switch (status.Path) {
        case cmsys::SystemTools::CopyStatus::SourcePath:
          *err = cmStrCat(*err, " (input)");
          break;
        case cmsys::SystemTools::CopyStatus::DestPath:
          *err = cmStrCat(*err, " (output)");
          break;
        default:
          break;
      }
    }
    return CopyResult::Failure;
  }
  if (perms) {
    perms = SystemTools::SetPermissions(newname, perm);
    if (!perms) {
      if (err) {
        *err = cmStrCat(perms.GetString(), " (output)");
      }
      return CopyResult::Failure;
    }
  }
  return CopyResult::Success;
}